

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness
          (DescriptorBuilder *this,EnumDescriptorProto *proto,EnumDescriptor *result)

{
  EnumValueDescriptor *pEVar1;
  undefined8 *puVar2;
  size_t __n;
  string *element_name;
  EnumDescriptor *pEVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  long *plVar7;
  mapped_type *ppEVar8;
  Type *pTVar9;
  size_t sVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_bool>
  pVar17;
  string error_message;
  string stripped;
  PrefixRemover remover;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  values;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>
  local_158;
  undefined1 *local_130;
  StringPiece local_128;
  long local_118;
  long lStack_110;
  EnumDescriptor *local_108;
  EnumDescriptorProto *local_100;
  key_type local_f8;
  DescriptorBuilder *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  undefined1 *local_b0;
  ulong local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  long local_90;
  long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  local_60;
  
  sVar10 = (*(undefined8 **)result)[1];
  local_108 = result;
  local_100 = proto;
  local_d8 = this;
  if ((long)sVar10 < 0) {
    StringPiece::LogFatalSizeTooBig(sVar10,"size_t to int conversion");
    local_130 = &local_a0;
    local_a8 = 0;
    local_a0 = 0;
    local_b0 = local_130;
  }
  else {
    local_60._M_impl._0_8_ = **(undefined8 **)result;
    local_130 = &local_a0;
    local_a8 = 0;
    local_a0 = 0;
    local_b0 = local_130;
    local_60._M_impl.super__Rb_tree_header._M_header._0_8_ = sVar10;
    if (sVar10 != 0) {
      lVar15 = 0;
      do {
        cVar4 = StringPiece::operator[]((StringPiece *)&local_60,lVar15);
        if (cVar4 != '_') {
          StringPiece::operator[]((StringPiece *)&local_60,lVar15);
          std::__cxx11::string::push_back((char)&local_b0);
        }
        lVar15 = lVar15 + 1;
        result = local_108;
      } while (lVar15 < (long)local_60._M_impl.super__Rb_tree_header._M_header._0_8_);
    }
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_60._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(result + 0x2c)) {
    local_100 = (EnumDescriptorProto *)&local_100->value_;
    lVar15 = 0;
    do {
      local_88 = *(long *)(result + 0x30);
      local_90 = lVar15 * 5;
      puVar2 = *(undefined8 **)(local_88 + lVar15 * 0x28);
      plVar7 = (long *)*puVar2;
      sVar10 = puVar2[1];
      if ((long)sVar10 < 0) {
        StringPiece::LogFatalSizeTooBig(sVar10,"size_t to int conversion");
      }
      local_128.ptr_ = (char *)plVar7;
      local_128.length_ = sVar10;
      if (local_a8 == 0 || sVar10 == 0) {
        uVar14 = 0;
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        uVar14 = 0;
        do {
          cVar4 = StringPiece::operator[](&local_128,uVar14);
          if (cVar4 != '_') {
            cVar5 = StringPiece::operator[](&local_128,uVar14);
            cVar4 = cVar5 + ' ';
            if (0x19 < (byte)(cVar5 + 0xbfU)) {
              cVar4 = cVar5;
            }
            if (cVar4 != local_b0[uVar13]) {
              plVar7 = (long *)local_128.ptr_;
              sVar10 = local_128.length_;
              if ((long *)local_128.ptr_ != (long *)0x0) goto LAB_002e52ee;
              goto LAB_002e5305;
            }
            uVar13 = uVar13 + 1;
          }
          uVar14 = uVar14 + 1;
        } while ((uVar14 < (ulong)local_128.length_) && (uVar13 < local_a8));
      }
      if (uVar13 < local_a8) {
LAB_002e5296:
        plVar7 = (long *)local_128.ptr_;
        sVar10 = local_128.length_;
        if ((long *)local_128.ptr_ == (long *)0x0) goto LAB_002e5305;
LAB_002e52ee:
        lVar16 = (long)local_128.ptr_ + local_128.length_;
LAB_002e52f1:
        local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,local_128.ptr_,lVar16);
      }
      else {
        while ((uVar14 < (ulong)local_128.length_ &&
               (cVar4 = StringPiece::operator[](&local_128,uVar14), cVar4 == '_'))) {
          uVar14 = uVar14 + 1;
        }
        sVar10 = local_128.length_ - uVar14;
        if (sVar10 == 0) goto LAB_002e5296;
        if (local_128.length_ < (long)uVar14) {
          __assert_fail("length_ >= n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.h"
                        ,0x119,
                        "void google::protobuf::StringPiece::remove_prefix(stringpiece_ssize_type)")
          ;
        }
        plVar7 = (long *)((long)local_128.ptr_ + uVar14);
        if ((long *)local_128.ptr_ != (long *)0x0) {
          lVar16 = (long)local_128.ptr_ + local_128.length_;
          local_128.ptr_ = (char *)((long)local_128.ptr_ + uVar14);
          local_128.length_ = sVar10;
          goto LAB_002e52f1;
        }
LAB_002e5305:
        local_128.length_ = sVar10;
        local_128.ptr_ = (char *)plVar7;
        local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
        local_158.first._M_string_length = 0;
        local_158.first.field_2._M_allocated_capacity =
             local_158.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)&local_f8);
      if (local_158.first._M_string_length != 0) {
        uVar14 = 0;
        uVar13 = local_158.first._M_string_length;
        do {
          if (local_158.first._M_dataplus._M_p[uVar14] != '_') {
            std::__cxx11::string::push_back((char)&local_f8);
            uVar13 = local_158.first._M_string_length;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar13);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.first._M_dataplus._M_p != &local_158.first.field_2) {
        operator_delete(local_158.first._M_dataplus._M_p,
                        local_158.first.field_2._M_allocated_capacity + 1);
      }
      local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_f8._M_dataplus._M_p,
                 local_f8._M_dataplus._M_p + local_f8._M_string_length);
      pEVar1 = (EnumValueDescriptor *)(local_88 + local_90 * 8);
      local_158.second = pEVar1;
      pVar17 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
               ::
               _M_emplace_unique<std::pair<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
                           *)&local_60,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158.first._M_dataplus._M_p != &local_158.first.field_2) {
        operator_delete(local_158.first._M_dataplus._M_p,
                        local_158.first.field_2._M_allocated_capacity + 1);
      }
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        plVar7 = *(long **)(pVar17.first._M_node._M_node + 2);
        puVar2 = (undefined8 *)*plVar7;
        __n = puVar2[1];
        if (((__n != (*(undefined8 **)pEVar1)[1]) ||
            ((__n != 0 &&
             (iVar6 = bcmp((void *)*puVar2,(void *)**(undefined8 **)pEVar1,__n), iVar6 != 0)))) &&
           ((int)plVar7[2] != *(int *)(pEVar1 + 0x10))) {
          std::operator+(&local_80,"When enum name is stripped and label is PascalCased (",&local_f8
                        );
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
          pEVar3 = local_108;
          local_d0 = &local_c0;
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_c0 = *plVar11;
            lStack_b8 = plVar7[3];
          }
          else {
            local_c0 = *plVar11;
            local_d0 = (long *)*plVar7;
          }
          local_c8 = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          ppEVar8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                  *)&local_60,&local_f8);
          plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,**(ulong **)*ppEVar8);
          local_128.ptr_ = (char *)&local_118;
          plVar11 = plVar7 + 2;
          if ((long *)*plVar7 == plVar11) {
            local_118 = *plVar11;
            lStack_110 = plVar7[3];
          }
          else {
            local_118 = *plVar11;
            local_128.ptr_ = (char *)*plVar7;
          }
          local_128.length_ = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_158.first._M_dataplus._M_p = (pointer)&local_158.first.field_2;
          puVar12 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_158.first.field_2._M_allocated_capacity = *puVar12;
            local_158.first.field_2._8_8_ = plVar7[3];
          }
          else {
            local_158.first.field_2._M_allocated_capacity = *puVar12;
            local_158.first._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158.first._M_string_length = plVar7[1];
          *plVar7 = (long)puVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((long *)local_128.ptr_ != &local_118) {
            operator_delete(local_128.ptr_,local_118 + 1);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,local_c0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          element_name = *(string **)(pEVar1 + 8);
          if (*(int *)(*(long *)(pEVar3 + 0x10) + 0x8c) == 2) {
            pTVar9 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                               ((RepeatedPtrFieldBase *)local_100,(int)lVar15);
            AddWarning(local_d8,element_name,&pTVar9->super_Message,NAME,&local_158.first);
          }
          else {
            pTVar9 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                               ((RepeatedPtrFieldBase *)local_100,(int)lVar15);
            AddError(local_d8,element_name,&pTVar9->super_Message,NAME,&local_158.first);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158.first._M_dataplus._M_p != &local_158.first.field_2) {
            operator_delete(local_158.first._M_dataplus._M_p,
                            local_158.first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      lVar15 = lVar15 + 1;
      result = local_108;
    } while (lVar15 < *(int *)(local_108 + 0x2c));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::~_Rb_tree(&local_60);
  if (local_b0 != local_130) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckEnumValueUniqueness(
    const EnumDescriptorProto& proto, const EnumDescriptor* result) {

  // Check that enum labels are still unique when we remove the enum prefix from
  // values that have it.
  //
  // This will fail for something like:
  //
  //   enum MyEnum {
  //     MY_ENUM_FOO = 0;
  //     FOO = 1;
  //   }
  //
  // By enforcing this reasonable constraint, we allow code generators to strip
  // the prefix and/or PascalCase it without creating conflicts.  This can lead
  // to much nicer language-specific enums like:
  //
  //   enum NameType {
  //     FirstName = 1,
  //     LastName = 2,
  //   }
  //
  // Instead of:
  //
  //   enum NameType {
  //     NAME_TYPE_FIRST_NAME = 1,
  //     NAME_TYPE_LAST_NAME = 2,
  //   }
  PrefixRemover remover(result->name());
  std::map<string, const google::protobuf::EnumValueDescriptor*> values;
  for (int i = 0; i < result->value_count(); i++) {
    const google::protobuf::EnumValueDescriptor* value = result->value(i);
    string stripped =
        EnumValueToPascalCase(remover.MaybeRemove(value->name()));
    std::pair<std::map<string, const google::protobuf::EnumValueDescriptor*>::iterator,
              bool>
        insert_result = values.insert(std::make_pair(stripped, value));
    bool inserted = insert_result.second;

    // We don't throw the error if the two conflicting symbols are identical, or
    // if they map to the same number.  In the former case, the normal symbol
    // duplication error will fire so we don't need to (and its error message
    // will make more sense). We allow the latter case so users can create
    // aliases which add or remove the prefix (code generators that do prefix
    // stripping should de-dup the labels in this case).
    if (!inserted && insert_result.first->second->name() != value->name() &&
        insert_result.first->second->number() != value->number()) {
      string error_message =
          "When enum name is stripped and label is PascalCased (" + stripped +
          "), this value label conflicts with " + values[stripped]->name() +
          ". This will make the proto fail to compile for some languages, such "
          "as C#.";
      // There are proto2 enums out there with conflicting names, so to preserve
      // compatibility we issue only a warning for proto2.
      if (result->file()->syntax() == FileDescriptor::SYNTAX_PROTO2) {
        AddWarning(value->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NAME, error_message);
      } else {
        AddError(value->full_name(), proto.value(i),
                 DescriptorPool::ErrorCollector::NAME, error_message);
      }
    }
  }
}